

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O3

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::
optimizeStep(HungarianBranching<lineage::heuristics::PartitionGraph> *this,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *first,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *second,bool mark_solution)

{
  pointer pAVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer pIVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  pointer pAVar9;
  pointer puVar10;
  runtime_error *prVar11;
  pointer pVVar12;
  ulong uVar13;
  PartitionGraph *pPVar14;
  difference_type __d_1;
  ulong uVar15;
  ulong uVar16;
  size_t row;
  long lVar17;
  ulong *puVar18;
  size_t sVar19;
  bool bVar20;
  double dVar21;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  matches;
  cost_t original_costs;
  anon_class_24_3_d1c0cc24 setCost;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  matcher;
  bipartite_graph_t bigraph;
  mask_t local_1c8;
  cost_t local_1a8;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  local_190;
  long local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  vector<double,_std::allocator<double>_> local_158;
  anon_class_24_3_d1c0cc24 local_140;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  local_128;
  bipartite_graph_t local_68;
  
  lVar5 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 2;
  lVar17 = (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  lVar7 = lVar6 + lVar17;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::vector(&local_68.vertices_,lVar7 * 2,(allocator_type *)&local_128);
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_68.multipleEdgesEnabled_ = false;
  local_140.costs = &local_1a8;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_140.mask = &local_1c8;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  puVar10 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_140.bigraph = &local_68;
  if ((first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar10) {
    local_178 = lVar17 + lVar7;
    pPVar14 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
    row = 0;
    do {
      lVar17 = local_178;
      sVar19 = row + local_178;
      dVar21 = PartitionGraph::terminationCosts(pPVar14,puVar10[row]);
      local_168 = sVar19;
      optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,row,sVar19,dVar21);
      local_160 = row + (lVar5 >> 3);
      local_170 = local_160 + lVar17;
      optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,local_160,local_170,0.0);
      pPVar14 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
      pVVar12 = (pPVar14->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = puVar10[row] * 0x40;
      for (puVar18 = *(ulong **)&((Adjacencies *)((long)(pVVar12 + puVar10[row]) + 0x20))->vector_;
          puVar18 != *(ulong **)((long)&pVVar12->to_ + lVar17 + 8U); puVar18 = puVar18 + 2) {
        local_128.graph_ = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)*puVar18;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          ((second->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                           (second->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish,&local_128);
        if (_Var8._M_current !=
            (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          pPVar14 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
          pVVar12 = (pPVar14->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                    vertices_.
                    super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar9 = *(pointer *)&((Adjacencies *)((long)(pVVar12 + puVar10[row]) + 0x20))->vector_;
          pAVar1 = *(pointer *)((long)(pVVar12 + puVar10[row]) + 0x28);
          uVar13 = (long)pAVar1 - (long)pAVar9 >> 4;
          while (uVar15 = uVar13, 0 < (long)uVar15) {
            uVar13 = uVar15 >> 1;
            if (*(Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> **)(pAVar9 + uVar13) <
                local_128.graph_) {
              pAVar9 = pAVar9 + uVar13 + 1;
              uVar13 = ~uVar13 + uVar15;
            }
          }
          if ((pAVar1 == pAVar9) ||
             ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)pAVar9->vertex_ !=
              local_128.graph_)) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Could not find edge (A, B)!");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar2 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar21 = PartitionGraph::costOfEdge(pPVar14,pAVar9->edge_);
          lVar17 = (long)_Var8._M_current - (long)puVar2 >> 3;
          sVar19 = lVar17 + lVar7;
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,row,sVar19,dVar21);
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,local_160,sVar19,dVar21);
          sVar19 = lVar17 + lVar6;
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,sVar19,local_168,0.0);
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,sVar19,local_170,0.0);
        }
        pPVar14 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
        pVVar12 = (pPVar14->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                  vertices_.
                  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = puVar10[row] << 6;
      }
      row = row + 1;
      puVar10 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (row < (ulong)((long)(first->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3));
  }
  puVar10 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar10) {
    uVar13 = 0;
    do {
      dVar21 = PartitionGraph::birthCosts
                         ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).
                          graph_,puVar10[uVar13]);
      optimizeStep::anon_class_24_3_d1c0cc24::operator()
                (&local_140,lVar6 + uVar13,lVar7 + uVar13,dVar21);
      uVar13 = uVar13 + 1;
      puVar10 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(second->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3
                             ));
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_158,&local_1a8);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::Matching(&local_128,&local_68,&local_1a8,&local_1c8);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::run(&local_128);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::matches(&local_190,&local_128);
  if ((long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    dVar21 = 0.0;
  }
  else {
    lVar5 = (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    dVar21 = 0.0;
    lVar6 = 0;
    do {
      if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] == 1) {
        dVar21 = dVar21 + local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6];
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  pIVar4 = local_190.
           super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (mark_solution) {
    for (; pIVar4 != local_190.
                     super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pIVar4 = pIVar4 + 1) {
      puVar10 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pIVar4->col <
          (ulong)(((long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3) + lVar7))
      {
        uVar13 = puVar10[pIVar4->col - lVar7];
        uVar15 = pIVar4->row;
        puVar10 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        lVar5 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar10;
        uVar16 = lVar5 >> 3;
        if ((uVar15 < uVar16) ||
           (bVar20 = uVar15 < (ulong)(lVar5 >> 2), uVar15 = uVar15 - uVar16, bVar20)) {
          uVar3 = puVar10[uVar15];
          pVVar12 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)
                    ->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                    super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar9 = *(pointer *)&((Adjacencies *)((long)(pVVar12 + uVar3) + 0x20))->vector_;
          pAVar1 = *(pointer *)((long)(pVVar12 + uVar3) + 0x28);
          uVar15 = (long)pAVar1 - (long)pAVar9 >> 4;
          while (uVar16 = uVar15, 0 < (long)uVar16) {
            uVar15 = uVar16 >> 1;
            if (pAVar9[uVar15].vertex_ < uVar13) {
              pAVar9 = pAVar9 + uVar15 + 1;
              uVar15 = ~uVar15 + uVar16;
            }
          }
          if ((pAVar1 == pAVar9) || (pAVar9->vertex_ != uVar13)) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Could not find matched edge!");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          (this->solution_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[pAVar9->edge_] = '\x01';
        }
      }
    }
  }
  if (local_190.
      super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.
                    super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.path_.
      super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.path_.
                    super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.path_.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.path_.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_128.cols_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.cols_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.cols_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.cols_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.rows_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.rows_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.rows_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.rows_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.edges_.
      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.edges_.
                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_68.edges_.
                             super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_68.edges_.
                             super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_68.edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::~vector(&local_68.vertices_);
  return dVar21;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimizeStep(std::vector<size_t> const& first,
                                        std::vector<size_t> const& second,
                                        bool mark_solution)
{
    // setup cost for matching.
    const size_t n_rows = 2 * first.size() + second.size();
    const size_t n_cols = n_rows;

    // lookup for auxiliary nodes.
    const size_t first_size = first.size();
    const size_t second_size = second.size();
    auto idxOfRow = [=](size_t row) { return row; };
    auto idxOfDuplicateRow = [=](size_t row) { return first_size + row; };
    auto idxOfBirthRow = [=](size_t col) { return 2 * first_size + col; };
    auto idxOfCol = [=](size_t col) { return n_rows + col; };
    auto idxOfTerminationCol = [=](size_t row) {
        return n_rows + second_size + row;
    };

    // construct auxiliary graph for matching.
    auto bigraph = bipartite_graph_t(n_rows + n_cols);
    auto costs = cost_t();
    auto mask = mask_t();

    auto setCost = [&](size_t row, size_t col, double val) {
        bigraph.insertEdge(row, col);
        costs.emplace_back(val);
        mask.emplace_back(0);
    };

    for (size_t row = 0; row < first.size(); ++row) {

        auto const& partitionIdA = first[row];

        // termination costs.

        setCost(idxOfRow(row), idxOfTerminationCol(row),
                this->graph_.terminationCosts(partitionIdA));
        setCost(idxOfDuplicateRow(row),
                idxOfTerminationCol(idxOfDuplicateRow(row)), .0);

        for (auto it = this->graph_.verticesFromVertexBegin(partitionIdA);
             it != this->graph_.verticesFromVertexEnd(partitionIdA); ++it) {
            auto const& partitionIdB = *it;

            const auto pos =
                std::find(second.cbegin(), second.cend(), partitionIdB);
            if (pos == second.cend()) { // if maxDistance is limited, then it
                                        // might be that the edge is not found.
                continue;
                // throw std::runtime_error(
                //        "Could not find neighbouring partition in frame
                //        t+1!");
            }
            const auto col = std::distance(second.cbegin(), pos);

            const auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find edge (A, B)!");

            auto const& coeff = this->graph_.costOfEdge(p.second);

            setCost(idxOfRow(row), idxOfCol(col), coeff);
            setCost(idxOfDuplicateRow(row), idxOfCol(col), coeff);

            // auxiliary edges.
            setCost(idxOfBirthRow(col), idxOfTerminationCol(row), .0);
            setCost(idxOfBirthRow(col),
                    idxOfTerminationCol(idxOfDuplicateRow(row)), .0);
        }
    }

    // birth costs.
    for (size_t col = 0; col < second.size(); ++col) {
        auto const& partitionIdB = second[col];
        setCost(idxOfBirthRow(col), idxOfCol(col),
                this->graph_.birthCosts(partitionIdB));
    }

    // Matching modifies the costs of the given vector, so we make a copy for
    // objective calculation later on.
    auto const original_costs = costs;

    auto matcher =
        markurem::matching::Matching<bipartite_graph_t, cost_t, mask_t>(
            bigraph, costs, mask);
    matcher.run();

    // calculate objective and mark edges.
    double objective = .0;
    auto const matches = matcher.matches();

    for (size_t idx = 0; idx < mask.size(); ++idx)
        if (mask[idx] == 1)
            objective += original_costs[idx];

    if (mark_solution) {
        for (auto const& match : matches) {
            // if the match involves to original nodes, then
            // mark the edge as matched in the solution.
            size_t partitionIdA, partitionIdB;
            if (match.col >= second.size() + n_rows)
                continue;
            else
                partitionIdB = second[match.col - n_rows];

            if (match.row < first.size())
                partitionIdA = first[match.row];
            else if (match.row < 2 * first.size())
                partitionIdA = first[match.row - first.size()];
            else
                continue;

            auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find matched edge!");

            solution_[p.second] = true;
        }
    }

    return objective;
}